

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> __thiscall
wallet::MakeDatabase
          (wallet *this,path *path,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  _Optional_payload_base<wallet::DatabaseFormat> _Var4;
  undefined7 extraout_var;
  byte bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  char cVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long in_FS_OFFSET;
  bool bVar12;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8 [2];
  long *local_b8 [2];
  long local_a8 [6];
  undefined1 local_78 [48];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)status;
  _Var4 = (_Optional_payload_base<wallet::DatabaseFormat>)
          std::filesystem::symlink_status((path *)path);
  if (_Var4._M_payload._0_1_ == -1) {
    if (options->require_existing != true) {
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_00c7b8f4:
      pbVar11 = pbVar10;
      if ((char)pbVar10 == '\0') {
        if (options->require_existing == true) {
          pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar1,
                     pcVar1 + (path->super_path)._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string>
                    (&local_138,
                     (tinyformat *)
                     "Failed to load database path \'%s\'. Data is not in recognized format.",
                     (char *)local_b8,pbVar7);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_138._M_dataplus._M_p,
                     local_138._M_dataplus._M_p + local_138._M_string_length);
          local_78._32_8_ = (_Impl *)local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 0x20),local_138._M_dataplus._M_p,
                     local_138._M_dataplus._M_p + local_138._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78 + 0x20));
          if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
            operator_delete((void *)local_78._32_8_,local_48[0] + 1);
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          local_f8[0].field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
          local_f8[0]._M_dataplus._M_p = local_138._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_00c7c0d0;
          goto LAB_00c7c0d8;
        }
      }
      else {
        if (options->require_create == true) {
          pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar1,
                     pcVar1 + (path->super_path)._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string>
                    (&local_158,
                     (tinyformat *)"Failed to create database path \'%s\'. Database already exists."
                     ,(char *)local_b8,pbVar7);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_158._M_dataplus._M_p,
                     local_158._M_dataplus._M_p + local_158._M_string_length);
          local_78._32_8_ = (_Impl *)local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 0x20),local_158._M_dataplus._M_p,
                     local_158._M_dataplus._M_p + local_158._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78 + 0x20));
          if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
            operator_delete((void *)local_78._32_8_,local_48[0] + 1);
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
          *status = FAILED_ALREADY_EXISTS;
          goto LAB_00c7c100;
        }
        if (((char)pbVar10 != '\0') &&
           (bVar5 = (byte)pbVar7 &
                    (options->require_format).
                    super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
                    super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged,
           pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71((int7)((ulong)pbVar7 >> 8),bVar5), (bVar5 & 1) != 0)) {
          bVar12 = (options->require_format).
                   super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
                   super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value ==
                   BERKELEY_RO;
          _Var4 = (_Optional_payload_base<wallet::DatabaseFormat>)((ulong)_Var4 & 0xffffffff);
          if (bVar12) {
            _Var4._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x2;
            _Var4._M_engaged = false;
            _Var4._5_3_ = 0;
          }
          pbVar7 = pbVar10;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          if (!bVar12) {
            pbVar11 = pbVar10;
          }
        }
      }
      cVar9 = (char)pbVar11;
      if (cVar9 == '\0') {
LAB_00c7b963:
        if ((options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
            _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged == true) {
          _Var4 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>
                  ._M_payload.super__Optional_payload_base<wallet::DatabaseFormat>;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)_Var4 >> 0x20);
        }
      }
      else {
        bVar12 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
                 _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71((int7)((ulong)pbVar7 >> 8),bVar12);
        if ((bVar12 == true) &&
           ((cVar9 != '\x01' ||
            (_Var4._M_payload._M_value !=
             (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
             _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value))))
        {
          pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar1,
                     pcVar1 + (path->super_path)._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string>
                    (&local_178,
                     (tinyformat *)
                     "Failed to load database path \'%s\'. Data is not in required format.",
                     (char *)local_b8,pbVar7);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_178._M_dataplus._M_p,
                     local_178._M_dataplus._M_p + local_178._M_string_length);
          local_78._32_8_ = (_Impl *)local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 0x20),local_178._M_dataplus._M_p,
                     local_178._M_dataplus._M_p + local_178._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78 + 0x20));
          if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
            operator_delete((void *)local_78._32_8_,local_48[0] + 1);
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          local_f8[0].field_2._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
          local_f8[0]._M_dataplus._M_p = local_178._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00c7c0d0;
          goto LAB_00c7c0d8;
        }
        if (cVar9 == '\0') goto LAB_00c7b963;
      }
      uVar8 = 1;
      if (((ulong)pbVar11 & 1) != 0) {
        uVar8 = (ulong)_Var4 & 0xffffffff;
      }
      iVar6 = (int)uVar8;
      if (iVar6 == 1) {
        MakeSQLiteDatabase((wallet *)local_78,path,options,status,error);
      }
      else {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71((int7)(uVar8 >> 8),iVar6 == 2);
        if (iVar6 != 2) {
          pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar1,
                     pcVar1 + (path->super_path)._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string>
                    (&local_198,
                     (tinyformat *)
                     "Failed to open database path \'%s\'. Build does not support Berkeley DB database format."
                     ,(char *)local_b8,pbVar7);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          local_78._32_8_ = (_Impl *)local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 0x20),local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78 + 0x20));
          if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
            operator_delete((void *)local_78._32_8_,local_48[0] + 1);
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_b8[0] != local_a8) goto LAB_00c7c0e5;
          goto LAB_00c7c0f5;
        }
        MakeBerkeleyRODatabase
                  ((path *)local_78,(DatabaseOptions *)path,(DatabaseStatus *)options,
                   (bilingual_str *)status);
      }
      uVar2 = local_78._0_8_;
      local_78._0_8_ = (pointer)0x0;
      *(undefined8 *)this = uVar2;
      goto LAB_00c7b9ec;
    }
    pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (&local_118,(tinyformat *)"Failed to load database path \'%s\'. Path does not exist.",
               (char *)local_b8,pbVar7);
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    local_78._32_8_ = (_Impl *)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 0x20),local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_78 + 0x20));
    if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
      operator_delete((void *)local_78._32_8_,local_48[0] + 1);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    *status = FAILED_NOT_FOUND;
  }
  else {
    BDBDataFile((path *)local_78,path);
    bVar12 = IsBDBFile((path *)local_78);
    std::filesystem::__cxx11::path::~path((path *)local_78);
    SQLiteDataFile((path *)local_78,path);
    bVar3 = IsSQLiteFile((path *)local_78);
    uVar8 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
    std::filesystem::__cxx11::path::~path((path *)local_78);
    bVar5 = (byte)uVar8;
    if ((bVar12 & bVar5) != 1) {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 ^ 1);
      _Var4._1_7_ = 0;
      _Var4._M_payload._M_value._0_1_ = bVar3;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(bVar12 | bVar5);
      goto LAB_00c7b8f4;
    }
    pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (local_f8,(tinyformat *)
                        "Failed to load database path \'%s\'. Data is in ambiguous format.",
               (char *)local_b8,pbVar7);
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_f8[0]._M_dataplus._M_p,
               local_f8[0]._M_dataplus._M_p + local_f8[0]._M_string_length);
    local_78._32_8_ = (_Impl *)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 0x20),local_f8[0]._M_dataplus._M_p,
               local_f8[0]._M_dataplus._M_p + local_f8[0]._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_78 + 0x20));
    if ((_Impl *)local_78._32_8_ != (_Impl *)local_48) {
      operator_delete((void *)local_78._32_8_,local_48[0] + 1);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
LAB_00c7c0d0:
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._0_8_ + 1);
    }
LAB_00c7c0d8:
    if (local_b8[0] != local_a8) {
LAB_00c7c0e5:
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
LAB_00c7c0f5:
    *status = FAILED_BAD_FORMAT;
  }
LAB_00c7c100:
  *(undefined8 *)this = 0;
LAB_00c7b9ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
          )(__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WalletDatabase> MakeDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    bool exists;
    try {
        exists = fs::symlink_status(path).type() != fs::file_type::not_found;
    } catch (const fs::filesystem_error& e) {
        error = Untranslated(strprintf("Failed to access database path '%s': %s", fs::PathToString(path), fsbridge::get_filesystem_error_message(e)));
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }

    std::optional<DatabaseFormat> format;
    if (exists) {
        if (IsBDBFile(BDBDataFile(path))) {
            format = DatabaseFormat::BERKELEY;
        }
        if (IsSQLiteFile(SQLiteDataFile(path))) {
            if (format) {
                error = Untranslated(strprintf("Failed to load database path '%s'. Data is in ambiguous format.", fs::PathToString(path)));
                status = DatabaseStatus::FAILED_BAD_FORMAT;
                return nullptr;
            }
            format = DatabaseFormat::SQLITE;
        }
    } else if (options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Path does not exist.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_NOT_FOUND;
        return nullptr;
    }

    if (!format && options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in recognized format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    if (format && options.require_create) {
        error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_ALREADY_EXISTS;
        return nullptr;
    }

    // If BERKELEY was the format, then change the format from BERKELEY to BERKELEY_RO
    if (format && options.require_format && format == DatabaseFormat::BERKELEY && options.require_format == DatabaseFormat::BERKELEY_RO) {
        format = DatabaseFormat::BERKELEY_RO;
    }

    // A db already exists so format is set, but options also specifies the format, so make sure they agree
    if (format && options.require_format && format != options.require_format) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in required format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    // Format is not set when a db doesn't already exist, so use the format specified by the options if it is set.
    if (!format && options.require_format) format = options.require_format;

    // If the format is not specified or detected, choose the default format based on what is available. We prefer BDB over SQLite for now.
    if (!format) {
#ifdef USE_SQLITE
        format = DatabaseFormat::SQLITE;
#endif
#ifdef USE_BDB
        format = DatabaseFormat::BERKELEY;
#endif
    }

    if (format == DatabaseFormat::SQLITE) {
#ifdef USE_SQLITE
        if constexpr (true) {
            return MakeSQLiteDatabase(path, options, status, error);
        } else
#endif
        {
            error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support SQLite database format.", fs::PathToString(path)));
            status = DatabaseStatus::FAILED_BAD_FORMAT;
            return nullptr;
        }
    }

    if (format == DatabaseFormat::BERKELEY_RO) {
        return MakeBerkeleyRODatabase(path, options, status, error);
    }

#ifdef USE_BDB
    if constexpr (true) {
        return MakeBerkeleyDatabase(path, options, status, error);
    } else
#endif
    {
        error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support Berkeley DB database format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }
}